

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::TextureSpecCase::renderTexCube
          (TextureSpecCase *this,Surface *dst,int width,int height,CubeFace face)

{
  ContextWrapper *this_00;
  int iVar1;
  int iVar2;
  uint program;
  uint uVar3;
  Context *pCVar4;
  TexCubeShader *shaders [6];
  TexCubeShader *local_78 [4];
  TexCubeShader *local_58;
  TexCubeShader *local_50;
  Vec3 local_48;
  Vec3 local_3c;
  
  this_00 = &this->super_ContextWrapper;
  iVar1 = sglr::ContextWrapper::getWidth(this_00);
  iVar2 = sglr::ContextWrapper::getHeight(this_00);
  local_78[0] = &this->m_texCubeNegXShader;
  local_78[1] = &this->m_texCubePosXShader;
  local_78[2] = &this->m_texCubeNegYShader;
  local_78[3] = &this->m_texCubePosYShader;
  local_58 = &this->m_texCubeNegZShader;
  local_50 = &this->m_texCubePosZShader;
  pCVar4 = sglr::ContextWrapper::getCurrentContext(this_00);
  program = (*pCVar4->_vptr_Context[0x75])(pCVar4,local_78[face]);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(this_00);
  (*pCVar4->_vptr_Context[0x76])(pCVar4,(ulong)program);
  uVar3 = (*pCVar4->_vptr_Context[0x66])(pCVar4,(ulong)program,"u_sampler0");
  (*pCVar4->_vptr_Context[0x5b])(pCVar4,(ulong)uVar3,0);
  pCVar4 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_3c.m_data[0] = -1.0;
  local_3c.m_data[1] = -1.0;
  local_3c.m_data[2] = 0.0;
  local_48.m_data[0] = (float)width / (float)iVar1 + (float)width / (float)iVar1 + -1.0;
  local_48.m_data[1] = (float)height / (float)iVar2 + (float)height / (float)iVar2 + -1.0;
  local_48.m_data[2] = 0.0;
  sglr::drawQuad(pCVar4,program,&local_3c,&local_48);
  readPixels(this,dst,0,0,width,height);
  return;
}

Assistant:

void TextureSpecCase::renderTexCube (tcu::Surface& dst, int width, int height, tcu::CubeFace face)
{
	int		targetW		= getWidth();
	int		targetH		= getHeight();

	float	w			= (float)width	/ (float)targetW;
	float	h			= (float)height	/ (float)targetH;

	TexCubeShader* shaders[] =
	{
		&m_texCubeNegXShader,
		&m_texCubePosXShader,
		&m_texCubeNegYShader,
		&m_texCubePosYShader,
		&m_texCubeNegZShader,
		&m_texCubePosZShader
	};

	deUint32	shaderID	= getCurrentContext()->createProgram(shaders[face]);

	shaders[face]->setUniforms(*getCurrentContext(), shaderID);
	sglr::drawQuad(*getCurrentContext(), shaderID, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(-1.0f + w*2.0f, -1.0f + h*2.0f, 0.0f));

	// Read pixels back.
	readPixels(dst, 0, 0, width, height);
}